

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void updext(int currow,int curcol)

{
  line *plVar1;
  long lVar2;
  
  if (1 < ncol) {
    lbound = curcol - (((uint)ncol >> 2) + curcol % (int)((uint)ncol >> 1));
    vtcol = -lbound;
    plVar1 = curwp->w_dotp;
    vtrow = currow;
    for (lVar2 = 0; lVar2 < plVar1->l_used; lVar2 = lVar2 + 1) {
      vtpute((uint)(byte)plVar1->l_text[lVar2],curwp);
    }
    vteeol();
    *vscreen[currow]->v_text = '$';
  }
  return;
}

Assistant:

void
updext(int currow, int curcol)
{
	struct line	*lp;			/* pointer to current line */
	int	 j;			/* index into line */

	if (ncol < 2)
		return;

	/*
	 * calculate what column the left bound should be
	 * (force cursor into middle half of screen)
	 */
	lbound = curcol - (curcol % (ncol >> 1)) - (ncol >> 2);

	/*
	 * scan through the line outputting characters to the virtual screen
	 * once we reach the left edge
	 */
	vtmove(currow, -lbound);		/* start scanning offscreen */
	lp = curwp->w_dotp;			/* line to output */
	for (j = 0; j < llength(lp); ++j)	/* until the end-of-line */
		vtpute(lgetc(lp, j), curwp);
	vteeol();				/* truncate the virtual line */
	vscreen[currow]->v_text[0] = '$';	/* and put a '$' in column 1 */
}